

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_defer_push_task_fn(fio_defer_task_s task,fio_task_queue_s *queue)

{
  fio_defer_queue_block_s *pfVar1;
  fio_defer_queue_block_s *pfVar2;
  int *piVar3;
  size_t sVar4;
  fio_lock_i ret;
  fio_lock_i ret_1;
  
  fio_lock(&queue->lock);
  pfVar1 = queue->writer;
  sVar4 = pfVar1->write;
  pfVar2 = pfVar1;
  if ((pfVar1->state != '\0') && (sVar4 == pfVar1->read)) {
    if ((queue->static_queue).state == '\x02') {
      pfVar2 = &queue->static_queue;
      pfVar1->next = pfVar2;
    }
    else {
      pfVar2 = (fio_defer_queue_block_s *)fio_malloc(0xfe0);
      queue->writer->next = pfVar2;
      if (pfVar2 == (fio_defer_queue_block_s *)0x0) {
        LOCK();
        queue->lock = '\0';
        UNLOCK();
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:913"
                        );
        }
        kill(0,2);
        piVar3 = __errno_location();
        exit(*piVar3);
      }
    }
    queue->writer = pfVar2;
    *(undefined8 *)((long)&pfVar2->write + 1) = 0;
    *(undefined8 *)((long)&pfVar2->read + 1) = 0;
    pfVar2->next = (fio_defer_queue_block_s *)0x0;
    pfVar2->write = 0;
    sVar4 = 0;
  }
  pfVar2->write = sVar4 + 1;
  pfVar2->tasks[sVar4].arg2 = task.arg2;
  pfVar2->tasks[sVar4].func = task.func;
  pfVar2->tasks[sVar4].arg1 = task.arg1;
  pfVar2 = queue->writer;
  if (pfVar2->write == 0xa8) {
    pfVar2->write = 0;
    pfVar2->state = '\x01';
  }
  LOCK();
  queue->lock = '\0';
  UNLOCK();
  return;
}

Assistant:

static inline void fio_defer_push_task_fn(fio_defer_task_s task,
                                          fio_task_queue_s *queue) {
  fio_lock(&queue->lock);

  /* test if full */
  if (queue->writer->state && queue->writer->write == queue->writer->read) {
    /* return to static buffer or allocate new buffer */
    if (queue->static_queue.state == 2) {
      queue->writer->next = &queue->static_queue;
    } else {
      queue->writer->next = fio_malloc(sizeof(*queue->writer->next));
      COUNT_ALLOC;
      if (!queue->writer->next)
        goto critical_error;
    }
    queue->writer = queue->writer->next;
    queue->writer->write = 0;
    queue->writer->read = 0;
    queue->writer->state = 0;
    queue->writer->next = NULL;
  }

  /* place task and finish */
  queue->writer->tasks[queue->writer->write++] = task;
  /* cycle buffer */
  if (queue->writer->write == DEFER_QUEUE_BLOCK_COUNT) {
    queue->writer->write = 0;
    queue->writer->state = 1;
  }
  fio_unlock(&queue->lock);
  return;

critical_error:
  fio_unlock(&queue->lock);
  FIO_ASSERT_ALLOC(NULL)
}